

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::CheckTypeStackEnd(TypeChecker *this,char *desc)

{
  bool bVar1;
  Result result_00;
  size_type sVar2;
  Label *local_28;
  Label *label;
  char *desc_local;
  TypeChecker *this_local;
  Result result;
  
  label = (Label *)desc;
  desc_local = (char *)this;
  result_00 = TopLabel(this,&local_28);
  bVar1 = Failed(result_00);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    sVar2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(&this->type_stack_);
    Result::Result((Result *)((long)&this_local + 4),(uint)(sVar2 != local_28->type_stack_limit));
    PrintStackIfFailed<>(this,this_local._4_4_,(char *)label);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::CheckTypeStackEnd(const char* desc) {
  Label* label;
  CHECK_RESULT(TopLabel(&label));
  Result result = (type_stack_.size() == label->type_stack_limit)
                      ? Result::Ok
                      : Result::Error;
  PrintStackIfFailed(result, desc);
  return result;
}